

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O1

void __thiscall
glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::deinit
          (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->rbo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x460))(1,&this->rbo_id);
    this->rbo_id = 0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (rbo_id != 0)
	{
		gl.deleteRenderbuffers(1, &rbo_id);

		rbo_id = 0;
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}